

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtcc_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  int iVar7;
  
  lVar4 = tcc_new();
  if (lVar4 != 0) {
    for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
      pcVar2 = argv[lVar6];
      if (*pcVar2 == '-') {
        cVar1 = pcVar2[1];
        if (cVar1 == 'L') {
          tcc_add_library_path(lVar4,pcVar2 + 2);
        }
        else if (cVar1 == 'I') {
          tcc_add_include_path(lVar4,pcVar2 + 2);
        }
        else if (cVar1 == 'B') {
          tcc_set_lib_path(lVar4,pcVar2 + 2);
        }
      }
    }
    iVar7 = 1;
    tcc_set_output_type(lVar4,1);
    iVar3 = tcc_compile_string(lVar4,my_program);
    if (iVar3 != -1) {
      tcc_add_symbol(lVar4,"add",add);
      tcc_add_symbol(lVar4,"hello","Hello World!");
      iVar3 = tcc_relocate(lVar4,1);
      if (-1 < iVar3) {
        pcVar5 = (code *)tcc_get_symbol(lVar4,"foo");
        if (pcVar5 != (code *)0x0) {
          (*pcVar5)(0x20);
          tcc_delete(lVar4);
          iVar7 = 0;
        }
      }
    }
    return iVar7;
  }
  fwrite("Could not create tcc state\n",0x1b,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  TCCState* s;
  int i;
  int (*func)(int);

  s = tcc_new();
  if (!s) {
    fprintf(stderr, "Could not create tcc state\n");
    exit(1);
  }

  /* if tcclib.h and libtcc1.a are not installed, where can we find them */
  for (i = 1; i < argc; ++i) {
    char* a = argv[i];
    if (a[0] == '-') {
      if (a[1] == 'B')
        tcc_set_lib_path(s, a + 2);
      else if (a[1] == 'I')
        tcc_add_include_path(s, a + 2);
      else if (a[1] == 'L')
        tcc_add_library_path(s, a + 2);
    }
  }

  /* MUST BE CALLED before any compilation */
  tcc_set_output_type(s, TCC_OUTPUT_MEMORY);

  if (tcc_compile_string(s, my_program) == -1)
    return 1;

  /* as a test, we add symbols that the compiled program can use.
     You may also open a dll with tcc_add_dll() and use symbols from that */
  tcc_add_symbol(s, "add", add);
  tcc_add_symbol(s, "hello", hello);

  /* relocate the code */
  if (tcc_relocate(s, TCC_RELOCATE_AUTO) < 0)
    return 1;

  /* get entry symbol */
  func = tcc_get_symbol(s, "foo");
  if (!func)
    return 1;

  /* run the code */
  func(32);

  /* delete the state */
  tcc_delete(s);

  return 0;
}